

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

RELEASED_HANDLE released_create(void)

{
  AMQP_VALUE pAVar1;
  RELEASED_HANDLE local_10;
  RELEASED_INSTANCE *released_instance;
  
  local_10 = (RELEASED_HANDLE)malloc(8);
  if (local_10 != (RELEASED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x26);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (RELEASED_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

RELEASED_HANDLE released_create(void)
{
    RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)malloc(sizeof(RELEASED_INSTANCE));
    if (released_instance != NULL)
    {
        released_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(38);
        if (released_instance->composite_value == NULL)
        {
            free(released_instance);
            released_instance = NULL;
        }
    }

    return released_instance;
}